

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMapping.c
# Opt level: O0

void Mips_get_insn_id(cs_struct *h,cs_insn *insn,uint id)

{
  undefined8 *puVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 in_EDX;
  uint *in_RSI;
  insn_map *in_RDI;
  uint i;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar2 = insn_find(in_RDI,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,
                    (unsigned_short **)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  uVar3 = (uint)uVar2;
  if ((uVar3 != 0) && (*in_RSI = (uint)insns[uVar3].mapid, *(int *)(in_RDI[1].regs_use + 7) != 0)) {
    puVar1 = *(undefined8 **)(in_RSI + 0x3c);
    *puVar1 = *(undefined8 *)insns[uVar3].regs_use;
    puVar1[1] = *(undefined8 *)(insns[uVar3].regs_use + 4);
    puVar1[2] = *(undefined8 *)(insns[uVar3].regs_use + 8);
    uVar4 = count_positive(insns[uVar3].regs_use);
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x20) = (char)uVar4;
    memcpy((void *)(*(long *)(in_RSI + 0x3c) + 0x22),insns[uVar3].regs_mod,0x28);
    uVar4 = count_positive(insns[uVar3].regs_mod);
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x4a) = (char)uVar4;
    *(undefined8 *)(*(long *)(in_RSI + 0x3c) + 0x4b) = *(undefined8 *)insns[uVar3].groups;
    uVar4 = count_positive8(insns[uVar3].groups);
    *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) = (char)uVar4;
    if (((insns[uVar3].branch & 1U) != 0) || ((insns[uVar3].indirect_branch & 1U) != 0)) {
      *(undefined1 *)
       (*(long *)(in_RSI + 0x3c) + 0x4b + (ulong)*(byte *)(*(long *)(in_RSI + 0x3c) + 0x53)) = 1;
      *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) =
           *(char *)(*(long *)(in_RSI + 0x3c) + 0x53) + '\x01';
    }
  }
  return;
}

Assistant:

void Mips_get_insn_id(cs_struct *h, cs_insn *insn, unsigned int id)
{
	unsigned int i;

	i = insn_find(insns, ARR_SIZE(insns), id, &h->insn_cache);
	if (i != 0) {
		insn->id = insns[i].mapid;

		if (h->detail) {
#ifndef CAPSTONE_DIET
			memcpy(insn->detail->regs_read, insns[i].regs_use, sizeof(insns[i].regs_use));
			insn->detail->regs_read_count = (uint8_t)count_positive(insns[i].regs_use);

			memcpy(insn->detail->regs_write, insns[i].regs_mod, sizeof(insns[i].regs_mod));
			insn->detail->regs_write_count = (uint8_t)count_positive(insns[i].regs_mod);

			memcpy(insn->detail->groups, insns[i].groups, sizeof(insns[i].groups));
			insn->detail->groups_count = (uint8_t)count_positive8(insns[i].groups);

			if (insns[i].branch || insns[i].indirect_branch) {
				// this insn also belongs to JUMP group. add JUMP group
				insn->detail->groups[insn->detail->groups_count] = MIPS_GRP_JUMP;
				insn->detail->groups_count++;
			}
#endif
		}
	}
}